

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lputil.c
# Opt level: O0

char * LPStatusString(LPStatus status)

{
  char *pcStack_10;
  LPStatus status_local;
  
  switch(status) {
  case LUNAPURPURA_OK:
    pcStack_10 = "OK";
    break;
  case LUNAPURPURA_ERROR:
    pcStack_10 = "Error";
    break;
  case LUNAPURPURA_CANTOPENFILE:
    pcStack_10 = "Can\'t open file";
    break;
  case LUNAPURPURA_BADMAGIC:
    pcStack_10 = "Bad magic";
    break;
  default:
    pcStack_10 = "";
  }
  return pcStack_10;
}

Assistant:

const char *
LPStatusString(const LPStatus status)
{
	switch (status) {
		case LUNAPURPURA_OK: return "OK"; break;
		case LUNAPURPURA_ERROR: return "Error"; break;
		case LUNAPURPURA_CANTOPENFILE: return "Can't open file"; break;
		case LUNAPURPURA_BADMAGIC: return "Bad magic"; break;
		default: return "";
	}
}